

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

bool __thiscall
SQCompilation::CheckerVisitor::detectNullCPattern
          (CheckerVisitor *this,TreeOp op,Expr *cond,Expr **checkee)

{
  bool bVar1;
  Node *pNVar2;
  Node *rhs;
  Expr *e;
  Id *pIVar3;
  Node *pNVar4;
  
  if ((op < TO_IN) && ((0x1ec000000U >> ((ulong)op & 0x3f) & 1) != 0)) {
    pNVar2 = &deparen((Expr *)cond[1].super_Node.super_ArenaObj._vptr_ArenaObj)->super_Node;
    rhs = &deparen(*(Expr **)&cond[1].super_Node._coordinates)->super_Node;
    pNVar4 = pNVar2;
    if ((pNVar2->_op == TO_NULLC) || (pNVar4 = rhs, rhs->_op == TO_NULLC)) {
      if (pNVar2 != pNVar4) {
        rhs = pNVar2;
      }
      pNVar2 = &deparen(*(Expr **)&pNVar4[1]._coordinates)->super_Node;
      e = deparen((Expr *)(((Node *)&pNVar4[1].super_ArenaObj)->super_ArenaObj)._vptr_ArenaObj);
      pIVar3 = extractReceiver(e);
      if ((pIVar3 != (Id *)0x0) &&
         ((rhs->_op == TO_ID ||
          (bVar1 = NodeEqualChecker::check((NodeEqualChecker *)&this->field_0x20,pNVar2,rhs), bVar1)
          ))) {
        *checkee = &pIVar3->super_Expr;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool CheckerVisitor::detectNullCPattern(enum TreeOp op, const Expr *cond, const Expr *&checkee) {

  // detect patterns like `(o?.x ?? D) <op> D` which implies o not null

  // (o?.f ?? D) != V -- then-branch implies `o` non-null
  // (o?.f ?? D) == V -- assume else-branch implies `o` non-null
  // (o?.f ?? D) > V -- then-b implies `o` non-null
  // (o?.f ?? D) < V -- then-b implies `o` non-null
  // (o?.f ?? D) >= V -- else-branch implies `o` non-null
  // (o?.f ?? D) <= V -- else-branch implies `o` non-null

  if (op != TO_LT && op != TO_GT && op != TO_EQ && op != TO_NE && op != TO_LE && op != TO_GE) {
    return false;
  }

  const BinExpr *bin = cond->asBinExpr();

  const Expr *lhs = deparen(bin->lhs());
  const Expr *rhs = deparen(bin->rhs());

  if (lhs->op() != TO_NULLC && rhs->op() != TO_NULLC) // -V522
    return false;

  const BinExpr *nullc = lhs->op() == TO_NULLC ? lhs->asBinExpr() : rhs->asBinExpr();
  const Expr *V = lhs == nullc ? rhs : lhs;
  const Expr *D = deparen(nullc->rhs());
  const Expr *candidate = deparen(nullc->lhs());

  const Expr *reciever = extractReceiver(candidate);

  if (reciever == nullptr)
    return false;

  if (V->op() == TO_ID || _equalChecker.check(D, V)) { // -V522
    checkee = reciever;
    return true;
  }

  return false;
}